

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O1

string * __thiscall lan::db::pop_next(string *__return_storage_ptr__,db *this,string *content)

{
  FILE *pFVar1;
  FILE FVar2;
  ulong spoint;
  size_type sVar3;
  size_type sVar4;
  pointer pcVar5;
  db *pdVar6;
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [24];
  _Alloc_hider local_a8;
  size_type local_a0 [2];
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70," \n\t","");
  pcVar5 = (content->_M_dataplus)._M_p;
  pdVar6 = (db *)local_d0;
  local_d0._0_8_ = (db_bits *)local_c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pdVar6,pcVar5,pcVar5 + content->_M_string_length);
  spoint = str_find_first_not_of(pdVar6,&local_70,(string *)local_d0,0);
  if ((db_bits *)local_d0._0_8_ != (db_bits *)local_c0) {
    operator_delete((void *)local_d0._0_8_,(ulong)(local_c0._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"=:;()[] \n\t","");
  pcVar5 = (content->_M_dataplus)._M_p;
  pdVar6 = (db *)local_f0;
  local_f0._0_8_ = (db_bits *)local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pdVar6,pcVar5,pcVar5 + content->_M_string_length);
  sVar3 = str_find_first_of(pdVar6,&local_90,(string *)local_f0,spoint);
  if ((db_bits *)local_f0._0_8_ != (db_bits *)local_e0) {
    operator_delete((void *)local_f0._0_8_,(ulong)(local_e0._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  sVar4 = sVar3;
  if ((long)sVar3 < 1) {
    sVar4 = content->_M_string_length;
  }
  if (-1 < (long)spoint) {
    sVar3 = sVar4;
  }
  if ((long)(sVar3 | spoint) < 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    FVar2 = *(FILE *)((content->_M_dataplus)._M_p + spoint);
    local_c0._16_8_ = local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_c0 + 0x10),",=:;([])","");
    if ((local_a8._M_p != (pointer)0x0) && (*(FILE *)local_c0._16_8_ != FVar2)) {
      pcVar5 = (pointer)0x1;
      do {
        if (local_a8._M_p == pcVar5) break;
        pFVar1 = (FILE *)(pcVar5 + local_c0._16_8_);
        pcVar5 = pcVar5 + 1;
      } while (*pFVar1 != FVar2);
    }
    if ((FILE *)local_c0._16_8_ != (FILE *)local_a0) {
      operator_delete((void *)local_c0._16_8_,local_a0[0] + 1);
    }
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)content);
    std::__cxx11::string::substr((ulong)local_50,(ulong)content);
    std::__cxx11::string::operator=((string *)content,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string db::pop_next(std::string & content){
            ssize_t start_p = str_find_first_not_of(" \n\t\0", content, 0);
            ssize_t end_p = str_find_first_of("=:;()[] \n\t\0", content, start_p);
            end_p = (end_p <= 0 and start_p >= 0) ? content.length() : end_p;
            if (start_p >= 0 and end_p >= 0){
                end_p = (str_compare(content[start_p], ",=:;([])")) ? start_p+1 : end_p;
                std::string str = content.substr(start_p, end_p-start_p);
                content = content.substr(end_p, content.length() - str.length());
                return str;
            } else return "";
        }